

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReceiver.cpp
# Opt level: O3

int __thiscall MyClientConnection::OnFileDone(MyClientConnection *this,TonkFile file)

{
  ostringstream *poVar1;
  uint64_t uVar2;
  char *pcVar3;
  undefined1 auVar4 [16];
  size_t sVar5;
  OutputWorker *pOVar6;
  int iVar7;
  undefined1 in_ZMM0 [64];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  undefined1 local_1b0 [392];
  undefined1 auVar8 [16];
  
  if ((file->Flags & 2) == 0) {
    if ((int)Logger.ChannelMinLevel < 3) {
      auVar4 = vcvtusi2ss_avx512f(in_ZMM0._0_16_,file->TotalBytes);
      uVar2 = file->ProgressBytes;
      poVar1 = (ostringstream *)(local_1b0 + 0x10);
      local_1b0._0_8_ = Logger.ChannelName;
      local_1b0._8_4_ = Info;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      auVar8._8_8_ = extraout_XMM1_Qb;
      auVar8._0_8_ = extraout_XMM1_Qa;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File(",5);
      pcVar3 = file->Name;
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)poVar1 + (int)*(undefined8 *)(local_1b0._16_8_ + -0x18));
        auVar8._8_8_ = extraout_XMM1_Qb_00;
        auVar8._0_8_ = extraout_XMM1_Qa_00;
      }
      else {
        sVar5 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar3,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") progress: ",0xc);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," / ",3);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," Bytes (",8);
      auVar8 = vcvtusi2ss_avx512f(auVar8,uVar2 * 100);
      std::ostream::_M_insert<double>((double)(auVar8._0_4_ / auVar4._0_4_));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"%)",2);
      pOVar6 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)local_1b0);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
    }
    if (file->OutputData == (uint8_t *)0x0) {
      if ((int)Logger.ChannelMinLevel < 3) {
        poVar1 = (ostringstream *)(local_1b0 + 0x10);
        local_1b0._0_8_ = Logger.ChannelName;
        local_1b0._8_4_ = Info;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"File transfer completed to disk: ",0x21);
        pcVar3 = file->OutputFileName;
        if (pcVar3 == (char *)0x0) {
          std::ios::clear((int)poVar1 + (int)*(undefined8 *)(local_1b0._16_8_ + -0x18));
        }
        else {
          sVar5 = strlen(pcVar3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar3,sVar5);
        }
        pOVar6 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)local_1b0);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
      }
      remove(file->Name);
      rename(file->OutputFileName,file->Name);
    }
    else if ((int)Logger.ChannelMinLevel < 3) {
      poVar1 = (ostringstream *)(local_1b0 + 0x10);
      local_1b0._0_8_ = Logger.ChannelName;
      local_1b0._8_4_ = Info;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Written to memory buffer: ",0x1a);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," bytes",6);
      pOVar6 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)local_1b0);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
    }
    iVar7 = 0;
    LOCK();
    (this->Client->Complete)._M_base._M_i = true;
    UNLOCK();
  }
  else {
    iVar7 = 1;
    if ((int)Logger.ChannelMinLevel < 5) {
      poVar1 = (ostringstream *)(local_1b0 + 0x10);
      local_1b0._0_8_ = Logger.ChannelName;
      local_1b0._8_4_ = Error;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"File transfer failed: ",0x16);
      pcVar3 = file->Name;
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)poVar1 + (int)*(undefined8 *)(local_1b0._16_8_ + -0x18));
      }
      else {
        sVar5 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar3,sVar5);
      }
      pOVar6 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)local_1b0);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
    }
  }
  return iVar7;
}

Assistant:

int MyClientConnection::OnFileDone(TonkFile file)
{
    if (file->Flags & TonkFileFlags_Failed)
    {
        Logger.Error("File transfer failed: ", file->Name);
        return TONK_FILE_DELETE;
    }

    Logger.Info("File(", file->Name, ") progress: ", file->ProgressBytes, " / ", file->TotalBytes,
        " Bytes (", file->ProgressBytes * 100 / (float)file->TotalBytes, "%)");

    if (file->OutputData)
    {
        Logger.Info("Written to memory buffer: ", file->TotalBytes, " bytes");
    }
    else
    {
        Logger.Info("File transfer completed to disk: ", file->OutputFileName);

        // Delete any old file with the target name
        std::remove(file->Name);

        // Rename the output file to the target file name
        std::rename(file->OutputFileName, file->Name);
    }

    // Mark it as complete so the session ends
    Client->Complete = true;

    return TONK_FILE_KEEP;
}